

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

BranchInstr * __thiscall IR::BranchInstr::CloneBranchInstr(BranchInstr *this)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LabelInstr *branchTarget;
  BranchInstr *pBVar4;
  
  bVar2 = IsMultiBranch(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x70c,"(!this->IsMultiBranch())",
                       "Cloning Not supported for MultiBranchInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  func = (this->super_Instr).m_func;
  branchTarget = LabelInstr::CloneLabel(this->m_branchTarget,0);
  if (branchTarget == (LabelInstr *)0x0) {
    branchTarget = this->m_branchTarget;
    func->topFunc->m_cloner->fRetargetClonedBranch = 1;
  }
  pBVar4 = New((this->super_Instr).m_opcode,branchTarget,func);
  return pBVar4;
}

Assistant:

BranchInstr *
BranchInstr::CloneBranchInstr() const
{
    AssertMsg(!this->IsMultiBranch(),"Cloning Not supported for MultiBranchInstr");
    Func * func = this->m_func;
    // See if the target has already been cloned.
    IR::LabelInstr * instrLabel = this->GetTarget()->CloneLabel(false);
    if (instrLabel == nullptr)
    {
        // We didn't find a clone for this label.
        // We'll go back and retarget the cloned branch if the target turns up in the cloned range.
        instrLabel = this->GetTarget();
        func->GetCloner()->fRetargetClonedBranch = TRUE;
    }
    return IR::BranchInstr::New(this->m_opcode, instrLabel, func);
}